

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmExtraCodeBlocksGenerator.cxx
# Opt level: O2

void __thiscall
cmExtraCodeBlocksGenerator::AppendTarget
          (cmExtraCodeBlocksGenerator *this,cmXMLWriter *xml,string *targetName,
          cmGeneratorTarget *target,string *make,cmLocalGenerator *lg,string *compiler,
          string *makeFlags)

{
  cmXMLWriter *pcVar1;
  TargetType TVar2;
  string *psVar3;
  cmValue cVar4;
  iterator iVar5;
  string *str;
  pointer pbVar6;
  pointer __rhs;
  string_view arg;
  string_view arg_00;
  string workingDir;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  includes;
  string buildType;
  int cbTargetType;
  string location;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  allIncludeDirs;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  cdefs;
  string makefileName;
  allocator<char> local_181;
  cmXMLWriter *local_180;
  string local_178;
  cmAlphaNum local_158;
  string local_128;
  cmGeneratorTarget *local_108;
  cmMakefile *local_100;
  cmAlphaNum local_f8;
  cmLocalGenerator *local_c8;
  cmExtraCodeBlocksGenerator *local_c0;
  string *local_b8;
  int local_ac;
  string local_a8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_88;
  string *local_70;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_68;
  string local_50;
  
  local_100 = lg->Makefile;
  local_108 = target;
  local_c8 = lg;
  local_c0 = this;
  local_b8 = make;
  local_70 = targetName;
  psVar3 = cmLocalGenerator::GetCurrentBinaryDirectory_abi_cxx11_(lg);
  local_158.View_._M_str = (psVar3->_M_dataplus)._M_p;
  local_158.View_._M_len = psVar3->_M_string_length;
  local_f8.View_._M_len = (size_t)&DAT_00000009;
  local_f8.View_._M_str = "/Makefile";
  cmStrCat<>(&local_50,&local_158,&local_f8);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_158,"Target",(allocator<char> *)&local_f8);
  cmXMLWriter::StartElement(xml,(string *)&local_158);
  std::__cxx11::string::~string((string *)&local_158);
  local_180 = xml;
  cmXMLWriter::Attribute<std::__cxx11::string>(xml,"title",local_70);
  if (local_108 == (cmGeneratorTarget *)0x0) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_158,"Option",(allocator<char> *)&local_f8);
    cmXMLWriter::StartElement(local_180,(string *)&local_158);
    std::__cxx11::string::~string((string *)&local_158);
    psVar3 = cmLocalGenerator::GetCurrentBinaryDirectory_abi_cxx11_(local_c8);
    cmXMLWriter::Attribute<std::__cxx11::string>(local_180,"working_dir",psVar3);
    cmXMLWriter::EndElement(local_180);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_158,"Option",(allocator<char> *)&local_f8);
    pcVar1 = local_180;
    cmXMLWriter::StartElement(local_180,(string *)&local_158);
    std::__cxx11::string::~string((string *)&local_158);
    local_158.View_._M_len = CONCAT44(local_158.View_._M_len._4_4_,4);
    cmXMLWriter::Attribute<int>(pcVar1,"type",(int *)&local_158);
    cmXMLWriter::EndElement(pcVar1);
  }
  else {
    local_ac = GetCBTargetType((cmExtraCodeBlocksGenerator *)xml,local_108);
    psVar3 = cmLocalGenerator::GetCurrentBinaryDirectory_abi_cxx11_(local_c8);
    std::__cxx11::string::string((string *)&local_158,(string *)psVar3);
    TVar2 = cmGeneratorTarget::GetType(local_108);
    if (TVar2 == EXECUTABLE) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_f8,"CMAKE_RUNTIME_OUTPUT_DIRECTORY",(allocator<char> *)&local_a8);
      cVar4 = cmMakefile::GetDefinition(local_100,(string *)&local_f8);
      std::__cxx11::string::~string((string *)&local_f8);
      if (cVar4.Value == (string *)0x0) {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_f8,"EXECUTABLE_OUTPUT_PATH",(allocator<char> *)&local_a8);
        cVar4 = cmMakefile::GetDefinition(local_100,(string *)&local_f8);
        std::__cxx11::string::~string((string *)&local_f8);
        if (cVar4.Value != (string *)0x0) {
          std::__cxx11::string::_M_assign((string *)&local_158);
        }
      }
      else {
        std::__cxx11::string::_M_assign((string *)&local_158);
      }
    }
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_a8,"CMAKE_BUILD_TYPE",(allocator<char> *)&local_178);
    psVar3 = cmMakefile::GetSafeDefinition(local_100,&local_a8);
    std::__cxx11::string::string((string *)&local_f8,(string *)psVar3);
    std::__cxx11::string::~string((string *)&local_a8);
    local_a8._M_dataplus._M_p = (pointer)&local_a8.field_2;
    local_a8._M_string_length = 0;
    local_a8.field_2._M_local_buf[0] = '\0';
    TVar2 = cmGeneratorTarget::GetType(local_108);
    if (TVar2 == OBJECT_LIBRARY) {
      CreateDummyTargetFile_abi_cxx11_
                (&local_178,(cmExtraCodeBlocksGenerator *)psVar3,local_c8,local_108);
      std::__cxx11::string::operator=((string *)&local_a8,(string *)&local_178);
      std::__cxx11::string::~string((string *)&local_178);
    }
    else {
      cmGeneratorTarget::GetLocation(local_108,(string *)&local_f8);
      std::__cxx11::string::_M_assign((string *)&local_a8);
    }
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_178,"Option",(allocator<char> *)&local_128);
    pcVar1 = local_180;
    cmXMLWriter::StartElement(local_180,&local_178);
    std::__cxx11::string::~string((string *)&local_178);
    cmXMLWriter::Attribute<std::__cxx11::string>(pcVar1,"output",&local_a8);
    pcVar1 = local_180;
    local_178._M_dataplus._M_p._0_4_ = 0;
    cmXMLWriter::Attribute<int>(local_180,"prefix_auto",(int *)&local_178);
    local_178._M_dataplus._M_p._0_4_ = 0;
    cmXMLWriter::Attribute<int>(pcVar1,"extension_auto",(int *)&local_178);
    cmXMLWriter::EndElement(pcVar1);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_178,"Option",(allocator<char> *)&local_128);
    pcVar1 = local_180;
    cmXMLWriter::StartElement(local_180,&local_178);
    std::__cxx11::string::~string((string *)&local_178);
    cmXMLWriter::Attribute<std::__cxx11::string>
              (pcVar1,"working_dir",
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_158);
    cmXMLWriter::EndElement(local_180);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_178,"Option",(allocator<char> *)&local_128);
    pcVar1 = local_180;
    cmXMLWriter::StartElement(local_180,&local_178);
    std::__cxx11::string::~string((string *)&local_178);
    cmXMLWriter::Attribute<char[3]>(pcVar1,"object_output",(char (*) [3])0x5ffd3e);
    cmXMLWriter::EndElement(local_180);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_178,"Option",(allocator<char> *)&local_128);
    pcVar1 = local_180;
    cmXMLWriter::StartElement(local_180,&local_178);
    std::__cxx11::string::~string((string *)&local_178);
    cmXMLWriter::Attribute<int>(pcVar1,"type",&local_ac);
    cmXMLWriter::EndElement(local_180);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_178,"Option",(allocator<char> *)&local_128);
    pcVar1 = local_180;
    cmXMLWriter::StartElement(local_180,&local_178);
    std::__cxx11::string::~string((string *)&local_178);
    cmXMLWriter::Attribute<std::__cxx11::string>(pcVar1,"compiler",compiler);
    cmXMLWriter::EndElement(local_180);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_178,"Compiler",(allocator<char> *)&local_128);
    cmXMLWriter::StartElement(local_180,&local_178);
    std::__cxx11::string::~string((string *)&local_178);
    local_68.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    local_68.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    local_68.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_178,"C",(allocator<char> *)&local_128);
    cmGeneratorTarget::GetCompileDefinitions(local_108,&local_68,(string *)&local_f8,&local_178);
    std::__cxx11::string::~string((string *)&local_178);
    pbVar6 = local_68.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    pcVar1 = local_180;
    for (__rhs = local_68.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start; __rhs != pbVar6; __rhs = __rhs + 1) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_178,"Add",(allocator<char> *)&local_128);
      cmXMLWriter::StartElement(local_180,&local_178);
      std::__cxx11::string::~string((string *)&local_178);
      std::operator+(&local_178,"-D",__rhs);
      cmXMLWriter::Attribute<std::__cxx11::string>(pcVar1,"option",&local_178);
      std::__cxx11::string::~string((string *)&local_178);
      cmXMLWriter::EndElement(pcVar1);
    }
    local_88.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    local_88.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_88.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_128._M_dataplus._M_p = (pointer)0x0;
    local_128._M_string_length = 0;
    local_128.field_2._M_allocated_capacity = 0;
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_178,"C",&local_181);
    cmLocalGenerator::GetIncludeDirectories
              (local_c8,(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)&local_128,local_108,&local_178,(string *)&local_f8);
    std::__cxx11::string::~string((string *)&local_178);
    ::cm::
    append<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_0>
              (&local_88,
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)&local_128);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&local_128);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_128,"CMAKE_EXTRA_GENERATOR_CXX_SYSTEM_INCLUDE_DIRS",&local_181);
    psVar3 = cmMakefile::GetSafeDefinition(local_100,&local_128);
    std::__cxx11::string::string((string *)&local_178,(string *)psVar3);
    std::__cxx11::string::~string((string *)&local_128);
    if (local_178._M_string_length != 0) {
      arg._M_str._4_4_ = local_178._M_dataplus._M_p._4_4_;
      arg._M_str._0_4_ = local_178._M_dataplus._M_p._0_4_;
      arg._M_len = local_178._M_string_length;
      cmExpandedList_abi_cxx11_
                ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)&local_128,arg,false);
      ::cm::
      append<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_0>
                (&local_88,
                 (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)&local_128);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&local_128);
    }
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_128,"CMAKE_EXTRA_GENERATOR_C_SYSTEM_INCLUDE_DIRS",&local_181);
    cmMakefile::GetSafeDefinition(local_100,&local_128);
    std::__cxx11::string::_M_assign((string *)&local_178);
    std::__cxx11::string::~string((string *)&local_128);
    if (local_178._M_string_length != 0) {
      arg_00._M_str._4_4_ = local_178._M_dataplus._M_p._4_4_;
      arg_00._M_str._0_4_ = local_178._M_dataplus._M_p._0_4_;
      arg_00._M_len = local_178._M_string_length;
      cmExpandedList_abi_cxx11_
                ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)&local_128,arg_00,false);
      ::cm::
      append<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_0>
                (&local_88,
                 (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)&local_128);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&local_128);
    }
    iVar5 = cmRemoveDuplicates<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
                      (&local_88);
    pcVar1 = local_180;
    for (pbVar6 = local_88.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start; pbVar6 != iVar5._M_current;
        pbVar6 = pbVar6 + 1) {
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_128,"Add",&local_181);
      cmXMLWriter::StartElement(pcVar1,&local_128);
      std::__cxx11::string::~string((string *)&local_128);
      cmXMLWriter::Attribute<std::__cxx11::string>(pcVar1,"directory",pbVar6);
      cmXMLWriter::EndElement(pcVar1);
    }
    cmXMLWriter::EndElement(local_180);
    std::__cxx11::string::~string((string *)&local_178);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_88);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_68);
    std::__cxx11::string::~string((string *)&local_a8);
    std::__cxx11::string::~string((string *)&local_f8);
    std::__cxx11::string::~string((string *)&local_158);
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_158,"MakeCommands",(allocator<char> *)&local_f8);
  cmXMLWriter::StartElement(local_180,(string *)&local_158);
  std::__cxx11::string::~string((string *)&local_158);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_158,"Build",(allocator<char> *)&local_f8);
  cmXMLWriter::StartElement(local_180,(string *)&local_158);
  std::__cxx11::string::~string((string *)&local_158);
  BuildMakeCommand((string *)&local_158,local_c0,local_b8,&local_50,local_70,makeFlags);
  pcVar1 = local_180;
  cmXMLWriter::Attribute<std::__cxx11::string>
            (local_180,"command",
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_158);
  std::__cxx11::string::~string((string *)&local_158);
  cmXMLWriter::EndElement(pcVar1);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_158,"CompileFile",(allocator<char> *)&local_f8);
  cmXMLWriter::StartElement(local_180,(string *)&local_158);
  std::__cxx11::string::~string((string *)&local_158);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_f8,"\"$file\"",(allocator<char> *)&local_a8);
  BuildMakeCommand((string *)&local_158,local_c0,local_b8,&local_50,(string *)&local_f8,makeFlags);
  pcVar1 = local_180;
  cmXMLWriter::Attribute<std::__cxx11::string>
            (local_180,"command",
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_158);
  std::__cxx11::string::~string((string *)&local_158);
  std::__cxx11::string::~string((string *)&local_f8);
  cmXMLWriter::EndElement(pcVar1);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_158,"Clean",(allocator<char> *)&local_f8);
  cmXMLWriter::StartElement(local_180,(string *)&local_158);
  std::__cxx11::string::~string((string *)&local_158);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_f8,"clean",(allocator<char> *)&local_a8);
  BuildMakeCommand((string *)&local_158,local_c0,local_b8,&local_50,(string *)&local_f8,makeFlags);
  pcVar1 = local_180;
  cmXMLWriter::Attribute<std::__cxx11::string>
            (local_180,"command",
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_158);
  std::__cxx11::string::~string((string *)&local_158);
  std::__cxx11::string::~string((string *)&local_f8);
  cmXMLWriter::EndElement(pcVar1);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_158,"DistClean",(allocator<char> *)&local_f8);
  cmXMLWriter::StartElement(local_180,(string *)&local_158);
  std::__cxx11::string::~string((string *)&local_158);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_f8,"clean",(allocator<char> *)&local_a8);
  BuildMakeCommand((string *)&local_158,local_c0,local_b8,&local_50,(string *)&local_f8,makeFlags);
  pcVar1 = local_180;
  cmXMLWriter::Attribute<std::__cxx11::string>
            (local_180,"command",
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_158);
  std::__cxx11::string::~string((string *)&local_158);
  std::__cxx11::string::~string((string *)&local_f8);
  cmXMLWriter::EndElement(pcVar1);
  cmXMLWriter::EndElement(local_180);
  cmXMLWriter::EndElement(local_180);
  std::__cxx11::string::~string((string *)&local_50);
  return;
}

Assistant:

void cmExtraCodeBlocksGenerator::AppendTarget(
  cmXMLWriter& xml, const std::string& targetName, cmGeneratorTarget* target,
  const std::string& make, const cmLocalGenerator* lg,
  const std::string& compiler, const std::string& makeFlags)
{
  cmMakefile const* makefile = lg->GetMakefile();
  std::string makefileName =
    cmStrCat(lg->GetCurrentBinaryDirectory(), "/Makefile");

  xml.StartElement("Target");
  xml.Attribute("title", targetName);

  if (target != nullptr) {
    int cbTargetType = this->GetCBTargetType(target);
    std::string workingDir = lg->GetCurrentBinaryDirectory();
    if (target->GetType() == cmStateEnums::EXECUTABLE) {
      // Determine the directory where the executable target is created, and
      // set the working directory to this dir.
      cmValue runtimeOutputDir =
        makefile->GetDefinition("CMAKE_RUNTIME_OUTPUT_DIRECTORY");
      if (runtimeOutputDir) {
        workingDir = *runtimeOutputDir;
      } else {
        cmValue executableOutputDir =
          makefile->GetDefinition("EXECUTABLE_OUTPUT_PATH");
        if (executableOutputDir) {
          workingDir = *executableOutputDir;
        }
      }
    }

    std::string buildType = makefile->GetSafeDefinition("CMAKE_BUILD_TYPE");
    std::string location;
    if (target->GetType() == cmStateEnums::OBJECT_LIBRARY) {
      location =
        this->CreateDummyTargetFile(const_cast<cmLocalGenerator*>(lg), target);
    } else {
      location = target->GetLocation(buildType);
    }

    xml.StartElement("Option");
    xml.Attribute("output", location);
    xml.Attribute("prefix_auto", 0);
    xml.Attribute("extension_auto", 0);
    xml.EndElement();

    xml.StartElement("Option");
    xml.Attribute("working_dir", workingDir);
    xml.EndElement();

    xml.StartElement("Option");
    xml.Attribute("object_output", "./");
    xml.EndElement();

    xml.StartElement("Option");
    xml.Attribute("type", cbTargetType);
    xml.EndElement();

    xml.StartElement("Option");
    xml.Attribute("compiler", compiler);
    xml.EndElement();

    xml.StartElement("Compiler");

    // the compilerdefines for this target
    std::vector<std::string> cdefs;
    target->GetCompileDefinitions(cdefs, buildType, "C");

    // Expand the list.
    for (std::string const& d : cdefs) {
      xml.StartElement("Add");
      xml.Attribute("option", "-D" + d);
      xml.EndElement();
    }

    // the include directories for this target
    std::vector<std::string> allIncludeDirs;
    {
      std::vector<std::string> includes;
      lg->GetIncludeDirectories(includes, target, "C", buildType);
      cm::append(allIncludeDirs, includes);
    }

    std::string systemIncludeDirs = makefile->GetSafeDefinition(
      "CMAKE_EXTRA_GENERATOR_CXX_SYSTEM_INCLUDE_DIRS");
    if (!systemIncludeDirs.empty()) {
      cm::append(allIncludeDirs, cmExpandedList(systemIncludeDirs));
    }

    systemIncludeDirs = makefile->GetSafeDefinition(
      "CMAKE_EXTRA_GENERATOR_C_SYSTEM_INCLUDE_DIRS");
    if (!systemIncludeDirs.empty()) {
      cm::append(allIncludeDirs, cmExpandedList(systemIncludeDirs));
    }

    auto end = cmRemoveDuplicates(allIncludeDirs);

    for (std::string const& str : cmMakeRange(allIncludeDirs.cbegin(), end)) {
      xml.StartElement("Add");
      xml.Attribute("directory", str);
      xml.EndElement();
    }

    xml.EndElement(); // Compiler
  } else              // e.g. all and the GLOBAL and UTILITY targets
  {
    xml.StartElement("Option");
    xml.Attribute("working_dir", lg->GetCurrentBinaryDirectory());
    xml.EndElement();

    xml.StartElement("Option");
    xml.Attribute("type", 4);
    xml.EndElement();
  }

  xml.StartElement("MakeCommands");

  xml.StartElement("Build");
  xml.Attribute(
    "command",
    this->BuildMakeCommand(make, makefileName, targetName, makeFlags));
  xml.EndElement();

  xml.StartElement("CompileFile");
  xml.Attribute(
    "command",
    this->BuildMakeCommand(make, makefileName, "\"$file\"", makeFlags));
  xml.EndElement();

  xml.StartElement("Clean");
  xml.Attribute(
    "command", this->BuildMakeCommand(make, makefileName, "clean", makeFlags));
  xml.EndElement();

  xml.StartElement("DistClean");
  xml.Attribute(
    "command", this->BuildMakeCommand(make, makefileName, "clean", makeFlags));
  xml.EndElement();

  xml.EndElement(); // MakeCommands
  xml.EndElement(); // Target
}